

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# np_nes_dmc.c
# Opt level: O3

void * NES_DMC_np_Create(UINT32 clock,UINT32 rate)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  NES_DMC *dmc;
  ulong uVar4;
  
  pvVar3 = calloc(1,0x40128);
  if (pvVar3 != (void *)0x0) {
    *(UINT32 *)((long)pvVar3 + 0x40094) = clock;
    uVar2 = clock - 0x195e8f;
    uVar1 = -uVar2;
    if (0 < (int)uVar2) {
      uVar1 = uVar2;
    }
    *(uint *)((long)pvVar3 + 0x4009c) = (uint)(uVar1 < 0x3e9);
    uVar4 = 0xac44;
    if (rate != 0) {
      uVar4 = (ulong)rate;
    }
    *(int *)((long)pvVar3 + 0x40098) = (int)uVar4;
    *(ulong *)((long)pvVar3 + 0x40118) = (uVar4 >> 1 | (ulong)clock << 0x20) / uVar4;
    *(undefined8 *)((long)pvVar3 + 0x40008) = 0x100000001;
    *(undefined8 *)((long)pvVar3 + 0x40010) = 0x100000001;
    *(undefined8 *)((long)pvVar3 + 0x4001c) = 0x100000001;
    *(undefined4 *)((long)pvVar3 + 0x40104) = 0x1d22;
    *(undefined4 *)((long)pvVar3 + 0x4010c) = 4;
    *(undefined8 *)((long)pvVar3 + 0x4002c) = 0x8000000080;
    *(undefined8 *)((long)pvVar3 + 0x40034) = 0x8000000080;
    *(undefined8 *)((long)pvVar3 + 0x4003c) = 0x8000000080;
  }
  return pvVar3;
}

Assistant:

void* NES_DMC_np_Create(UINT32 clock, UINT32 rate)
{
	NES_DMC* dmc;
	int c, t;

	dmc = (NES_DMC*)calloc(1, sizeof(NES_DMC));
	if (dmc == NULL)
		return NULL;

	NES_DMC_np_SetClock(dmc, clock);
	NES_DMC_np_SetRate(dmc, rate);
	dmc->option[OPT_ENABLE_4011] = 1;
	dmc->option[OPT_ENABLE_PNOISE] = 1;
	dmc->option[OPT_UNMUTE_ON_RESET] = 1;
	dmc->option[OPT_DPCM_ANTI_CLICK] = 0;
	dmc->option[OPT_NONLINEAR_MIXER] = 1;
	dmc->option[OPT_RANDOMIZE_NOISE] = 1;
	dmc->option[OPT_TRI_MUTE] = 1;
	dmc->option[OPT_TRI_NULL] = 0;
	dmc->tnd_table[0][0][0][0] = 0;
	dmc->tnd_table[1][0][0][0] = 0;

	dmc->apu = NULL;
	dmc->frame_sequence_count = 0;
	dmc->frame_sequence_length = 7458;
	dmc->frame_sequence_steps = 4;

	for(c=0;c<2;++c)
		for(t=0;t<3;++t)
			dmc->sm[c][t] = 128;

	return dmc;
}